

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void Js::JavascriptArray::ArraySpliceHelper<int>
               (JavascriptArray *pnewArr,JavascriptArray *pArr,uint32 start,uint32 deleteLen,
               Var *insertArgs,uint32 insertLen,ScriptContext *scriptContext)

{
  Type *addr;
  Type TVar1;
  Recycler *recycler;
  code *pcVar2;
  Type *addr_00;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  SparseArraySegment<int> *pSVar7;
  SparseArraySegmentBase *pSVar8;
  SparseArraySegmentBase *pSVar9;
  SparseArraySegmentBase *pSVar10;
  uint32 uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  Type *addr_01;
  Type *prev;
  Type *local_48;
  uint32 headDeleteLen;
  
  recycler = scriptContext->recycler;
  if ((pArr->head).ptr == (SparseArraySegmentBase *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1c5f,"(pArr->head)","pArr->head");
    if (!bVar3) goto LAB_00ba3287;
    *puVar6 = 0;
  }
  addr = &pArr->head;
  if (addr->ptr == EmptySegment) {
    AllocateHead<int>(pArr);
  }
  pSVar10 = addr->ptr;
  uVar5 = pSVar10->left + pSVar10->size;
  if (CARRY4(pSVar10->left,pSVar10->size)) {
    uVar5 = 0xffffffff;
  }
  prev = addr;
  if (start < uVar5) {
    bVar3 = true;
    pSVar8 = (SparseArraySegmentBase *)0x0;
    local_48 = addr;
  }
  else {
    do {
      local_48 = prev;
      pSVar8 = pSVar10;
      pSVar10 = (pSVar8->next).ptr;
      if ((pSVar10 != (SparseArraySegmentBase *)0x0) &&
         (uVar5 = pSVar10->left + pSVar10->size, CARRY4(pSVar10->left,pSVar10->size))) {
        uVar5 = 0xffffffff;
      }
      prev = &pSVar8->next;
      bVar3 = pSVar10 != (SparseArraySegmentBase *)0x0;
    } while ((bVar3) && (uVar5 <= start));
  }
  bVar4 = IsInlineSegment(pSVar10,pArr);
  if (bVar3) {
    uVar13 = deleteLen + start;
    uVar5 = pSVar10->left;
    if ((uVar5 <= start) && (uVar13 <= pSVar10->length + uVar5)) {
      pSVar8 = (pSVar10->next).ptr;
      ArraySegmentSpliceHelper<int>
                (pnewArr,(SparseArraySegment<int> *)pSVar10,(Type *)prev,start,deleteLen,insertArgs,
                 insertLen,recycler);
      if (pSVar8 != (SparseArraySegmentBase *)0x0) {
        do {
          pSVar8->left = pSVar8->left + (insertLen - deleteLen);
          if ((pSVar8->next).ptr == (SparseArraySegmentBase *)0x0) {
            SparseArraySegmentBase::EnsureSizeInBound(pSVar8);
          }
          pSVar8 = (pSVar8->next).ptr;
        } while (pSVar8 != (SparseArraySegmentBase *)0x0);
      }
      if (prev->ptr == (SparseArraySegmentBase *)0x0) {
        return;
      }
      SparseArraySegmentBase::EnsureSizeInBound(prev->ptr);
      return;
    }
    addr_01 = &pnewArr->head;
    if (uVar5 < start) {
      uVar5 = uVar5 + pSVar10->length;
      uVar11 = uVar5 - start;
      if (start <= uVar5 && uVar11 != 0) {
        if (((pSVar10->next).ptr != (SparseArraySegmentBase *)0x0) ||
           (bVar3 = Phases::IsEnabled((Phases *)&DAT_015bbe90,NativeArrayLeafSegmentPhase), bVar3))
        {
          pSVar7 = SparseArraySegment<int>::AllocateSegmentImpl<false>
                             (recycler,0,uVar11,uVar11,(SparseArraySegmentBase *)0x0);
        }
        else {
          pSVar7 = SparseArraySegment<int>::AllocateSegmentImpl<true>
                             (recycler,0,uVar11,uVar11,(SparseArraySegmentBase *)0x0);
        }
        pSVar8 = &SparseArraySegment<int>::CopySegment
                            (recycler,pSVar7,0,(SparseArraySegment<int> *)pSVar10,start,uVar11)->
                  super_SparseArraySegmentBase;
        (pSVar8->next).ptr = (SparseArraySegmentBase *)0x0;
        Memory::Recycler::WBSetBit((char *)addr_01);
        addr_01->ptr = pSVar8;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_01);
        SparseArraySegment<int>::Truncate((SparseArraySegment<int> *)pSVar10,start);
        addr_01 = &pSVar8->next;
      }
      local_48 = prev;
      prev = &pSVar10->next;
      pSVar8 = pSVar10;
LAB_00ba2bbb:
      pSVar10 = (pSVar10->next).ptr;
    }
    else if (bVar4) {
      if ((start < uVar5) ||
         (uVar14 = pSVar10->length + uVar5, uVar11 = uVar14 - start, uVar14 < start || uVar11 == 0))
      {
        if ((uVar5 != 0) || (pSVar10->length != 0)) goto LAB_00ba2bbf;
        if (pSVar10->size == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x1cda,"(startSeg->size != 0)","startSeg->size != 0");
          if (!bVar3) goto LAB_00ba3287;
          *puVar6 = 0;
        }
        pSVar9 = (pSVar10->next).ptr;
        Memory::Recycler::WBSetBit((char *)prev);
        prev->ptr = pSVar9;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(prev);
      }
      else {
        if ((pSVar10->next).ptr == (SparseArraySegmentBase *)0x0) {
          pSVar7 = SparseArraySegment<int>::AllocateSegment
                             (recycler,0,uVar11,uVar11,(SparseArraySegmentBase *)0x0);
        }
        else {
          pSVar7 = SparseArraySegment<int>::AllocateSegmentImpl<false>
                             (recycler,0,uVar11,uVar11,(SparseArraySegmentBase *)0x0);
        }
        pSVar9 = &SparseArraySegment<int>::CopySegment
                            (recycler,pSVar7,0,(SparseArraySegment<int> *)pSVar10,start,uVar11)->
                  super_SparseArraySegmentBase;
        Memory::Recycler::WBSetBit((char *)addr_01);
        addr_01->ptr = pSVar9;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_01);
        addr_01 = &pSVar9->next;
        pSVar9 = (pSVar10->next).ptr;
        Memory::Recycler::WBSetBit((char *)prev);
        prev->ptr = pSVar9;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(prev);
        (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])
                  (pArr,pSVar10,0);
      }
      goto LAB_00ba2bbb;
    }
LAB_00ba2bbf:
    bVar3 = pSVar10 == (SparseArraySegmentBase *)0x0;
    if (!bVar3) {
      TVar1 = pSVar10->left;
      uVar5 = pSVar10->length + TVar1;
      addr_00 = addr_01;
      pSVar9 = pSVar10;
      while (addr_01 = addr_00, pSVar10 = pSVar9, uVar5 <= uVar13) {
        addr_01 = &pSVar9->next;
        pSVar10 = (pSVar9->next).ptr;
        pSVar9->left = TVar1 - start;
        (pSVar9->next).ptr = (SparseArraySegmentBase *)0x0;
        Memory::Recycler::WBSetBit((char *)addr_00);
        addr_00->ptr = pSVar9;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
        Memory::Recycler::WBSetBit((char *)prev);
        prev->ptr = pSVar10;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(prev);
        bVar3 = pSVar10 == (SparseArraySegmentBase *)0x0;
        if (bVar3) break;
        TVar1 = pSVar10->left;
        addr_00 = addr_01;
        pSVar9 = pSVar10;
        uVar5 = pSVar10->length + TVar1;
      }
    }
    bVar4 = true;
    if (pSVar8 == (SparseArraySegmentBase *)0x0) {
      if ((bVar3) || (pSVar10->left != 0)) {
        if (addr->ptr != pSVar10) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x1cf6,"(pArr->head == startSeg)","pArr->head == startSeg");
          if (!bVar4) goto LAB_00ba3287;
          *puVar6 = 0;
        }
        EnsureHeadStartsFromZero<int>(pArr,recycler);
        pSVar8 = (pArr->head).ptr;
        if ((pSVar8 == (SparseArraySegmentBase *)0x0) || ((pSVar8->next).ptr != pSVar10)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x1cf8,"(pArr->head && pArr->head->next == startSeg)",
                                      "pArr->head && pArr->head->next == startSeg");
          if (!bVar4) goto LAB_00ba3287;
          *puVar6 = 0;
        }
        pSVar8 = addr->ptr;
        bVar4 = false;
        local_48 = prev;
        prev = &pSVar8->next;
      }
      else {
        pSVar8 = (SparseArraySegmentBase *)0x0;
      }
    }
    if (!bVar3) {
      uVar5 = pSVar10->left;
      uVar14 = uVar13 - uVar5;
      if (uVar5 <= uVar13 && uVar14 != 0) {
        bVar3 = Phases::IsEnabled((Phases *)&DAT_015bbe90,NativeArrayLeafSegmentPhase);
        if (bVar3) {
          pSVar7 = SparseArraySegment<int>::AllocateSegmentImpl<false>
                             (recycler,uVar5 - start,uVar14,(SparseArraySegmentBase *)0x0);
        }
        else {
          pSVar7 = SparseArraySegment<int>::AllocateSegmentImpl<true>
                             (recycler,uVar5 - start,uVar14,(SparseArraySegmentBase *)0x0);
        }
        pSVar9 = &SparseArraySegment<int>::CopySegment
                            (recycler,pSVar7,pSVar10->left - start,
                             (SparseArraySegment<int> *)pSVar10,pSVar10->left,uVar14)->
                  super_SparseArraySegmentBase;
        (pSVar9->next).ptr = (SparseArraySegmentBase *)0x0;
        Memory::Recycler::WBSetBit((char *)addr_01);
        addr_01->ptr = pSVar9;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_01);
        uVar12 = (ulong)(pSVar10->length - uVar14);
        memmove_xplat(pSVar10 + 1,&pSVar10[1].left + uVar14,uVar12 * 4);
        if ((g_verifyIsNotBarrierAddress != (code *)0x0 & DAT_015d641c) == 1) {
          (*g_verifyIsNotBarrierAddress)(pSVar10 + 1,uVar12);
        }
        pSVar10->left = pSVar10->left + uVar14;
        pSVar10->length = pSVar10->length - uVar14;
        SparseArraySegmentBase::CheckLengthvsSize(pSVar10);
        SparseArraySegment<int>::Truncate
                  ((SparseArraySegment<int> *)pSVar10,pSVar10->length + pSVar10->left);
        SparseArraySegmentBase::EnsureSizeInBound(pSVar10);
      }
      if (!bVar4 && pSVar10->left - deleteLen == -insertLen) {
        if (-insertLen != start) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x1d17,"(start + insertLen == 0)","start + insertLen == 0");
          if (!bVar3) goto LAB_00ba3287;
          *puVar6 = 0;
        }
        Memory::Recycler::WBSetBit((char *)addr);
        addr->ptr = pSVar10;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
        pSVar8 = (SparseArraySegmentBase *)0x0;
        prev = addr;
      }
    }
    if (pSVar10 != (SparseArraySegmentBase *)0x0) {
      do {
        pSVar10->left = pSVar10->left + (insertLen - deleteLen);
        if ((pSVar10->next).ptr == (SparseArraySegmentBase *)0x0) {
          SparseArraySegmentBase::EnsureSizeInBound(pSVar10);
        }
        pSVar10 = (pSVar10->next).ptr;
      } while (pSVar10 != (SparseArraySegmentBase *)0x0);
    }
  }
  SparseArraySegmentBase::EnsureSizeInBound((pnewArr->head).ptr);
  if (pSVar8 != (SparseArraySegmentBase *)0x0) {
    SparseArraySegmentBase::EnsureSizeInBound(pSVar8);
  }
  if (insertLen == 0) {
    return;
  }
  bVar3 = VarIs<Js::JavascriptNativeIntArray,Js::JavascriptArray>(pArr);
  if ((bVar3) || (bVar3 = VarIs<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(pArr), bVar3)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1d34,
                                "(!VarIs<JavascriptNativeIntArray>(pArr) && !VarIs<JavascriptNativeFloatArray>(pArr))"
                                ,
                                "!VarIs<JavascriptNativeIntArray>(pArr) && !VarIs<JavascriptNativeFloatArray>(pArr)"
                               );
    if (!bVar3) goto LAB_00ba3287;
    *puVar6 = 0;
  }
  if (pSVar8 != (SparseArraySegmentBase *)0x0) {
    if (start < pSVar8->left) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1d3a,"(!savePrev || savePrev->left <= start)",
                                  "!savePrev || savePrev->left <= start");
      if (!bVar3) {
LAB_00ba3287:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    uVar13 = start - pSVar8->left;
    uVar5 = pSVar8->size - uVar13;
    if (uVar13 <= pSVar8->size && uVar5 != 0) {
      uVar11 = insertLen - uVar5;
      pSVar10 = pSVar8;
      if (uVar5 <= insertLen && uVar11 != 0) {
        bVar3 = IsInlineSegment(pSVar8,pArr);
        pSVar10 = (pSVar8->next).ptr;
        if (pSVar10 == (SparseArraySegmentBase *)0x0) {
          pSVar10 = &SparseArraySegment<int>::GrowByMin
                               ((SparseArraySegment<int> *)pSVar8,recycler,uVar11)->
                     super_SparseArraySegmentBase;
        }
        else {
          pSVar10 = &SparseArraySegment<int>::GrowByMinMax
                               ((SparseArraySegment<int> *)pSVar8,recycler,uVar11,
                                pSVar10->left - (pSVar8->left + pSVar8->size))->
                     super_SparseArraySegmentBase;
        }
        if (bVar3) {
          (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])
                    (pArr,pSVar8,0);
        }
      }
      Memory::Recycler::WBSetBit((char *)local_48);
      local_48->ptr = pSVar10;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(local_48);
      pSVar10->length = (start + insertLen) - pSVar10->left;
      SparseArraySegmentBase::CheckLengthvsSize(pSVar10);
      goto LAB_00ba31b8;
    }
  }
  pSVar10 = prev->ptr;
  bVar3 = Phases::IsEnabled((Phases *)&DAT_015bbe90,NativeArrayLeafSegmentPhase);
  if ((pSVar10 != (SparseArraySegmentBase *)0x0) || (bVar3)) {
    pSVar10 = &SparseArraySegment<int>::AllocateSegmentImpl<false>(recycler,start,insertLen,pSVar10)
               ->super_SparseArraySegmentBase;
  }
  else {
    pSVar10 = &SparseArraySegment<int>::AllocateSegmentImpl<true>
                         (recycler,start,insertLen,(SparseArraySegmentBase *)0x0)->
               super_SparseArraySegmentBase;
  }
  pSVar8 = prev->ptr;
  Memory::Recycler::WBSetBit((char *)&pSVar10->next);
  (pSVar10->next).ptr = pSVar8;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&pSVar10->next);
  Memory::Recycler::WBSetBit((char *)prev);
  prev->ptr = pSVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(prev);
LAB_00ba31b8:
  Memory::CopyArray<int,int,Memory::Recycler>
            ((int *)(&((SparseArraySegmentBase *)&pSVar10[1].left)->left +
                    (start - ((SparseArraySegmentBase *)&pSVar10->left)->left)),(ulong)insertLen,
             (int *)insertArgs,(ulong)insertLen);
  return;
}

Assistant:

void JavascriptArray::ArraySpliceHelper(JavascriptArray* pnewArr, JavascriptArray* pArr, uint32 start, uint32 deleteLen, Var* insertArgs, uint32 insertLen, ScriptContext *scriptContext)
    {
        // Skip pnewArr->EnsureHead(): we don't use existing segment at all.
        Recycler *recycler  = scriptContext->GetRecycler();

        Field(SparseArraySegmentBase*)* prevSeg  = &pArr->head;        // holds the next pointer of previous
        Field(SparseArraySegmentBase*)* prevPrevSeg  = &pArr->head;    // this holds the previous pointer to prevSeg dirty trick.
        SparseArraySegmentBase* savePrev = nullptr;

        Assert(pArr->head); // We should never have a null head.
        pArr->EnsureHead<T>();
        SparseArraySegment<T>* startSeg = SparseArraySegment<T>::From(pArr->head);

        const uint32 limit = start + deleteLen;
        uint32 rightLimit;
        if (UInt32Math::Add(startSeg->left, startSeg->size, &rightLimit))
        {
            rightLimit = JavascriptArray::MaxArrayLength;
        }

        // Find out the segment to start delete
        while (startSeg && (rightLimit <= start))
        {
            savePrev = startSeg;
            prevPrevSeg = prevSeg;
            prevSeg = &startSeg->next;
            startSeg = SparseArraySegment<T>::From(startSeg->next);

            if (startSeg)
            {
                if (UInt32Math::Add(startSeg->left, startSeg->size, &rightLimit))
                {
                    rightLimit = JavascriptArray::MaxArrayLength;
                }
            }
        }

        bool hasInlineSegment = JavascriptArray::IsInlineSegment(startSeg, pArr);
        if (startSeg)
        {
            // Delete Phase
            if (startSeg->left <= start && (startSeg->left + startSeg->length) >= limit)
            {
                // All splice happens in one segment.
                SparseArraySegmentBase *nextSeg = startSeg->next;
                // Splice the segment first, which might OOM throw but the array would be intact.
                JavascriptArray::ArraySegmentSpliceHelper(
                    pnewArr, startSeg, SparseArraySegment<T>::AddressFrom(prevSeg),
                    start, deleteLen, insertArgs, insertLen, recycler);
                while (nextSeg)
                {
                    // adjust next segments left
                    nextSeg->left = nextSeg->left - deleteLen + insertLen;
                    if (nextSeg->next == nullptr)
                    {
                        nextSeg->EnsureSizeInBound();
                    }
                    nextSeg = nextSeg->next;
                }
                if (*prevSeg)
                {
                    (*prevSeg)->EnsureSizeInBound();
                }
                return;
            }
            else
            {
                SparseArraySegment<T>* newHeadSeg = nullptr; // pnewArr->head is null
                Field(SparseArraySegmentBase*)* prevNewHeadSeg = &pnewArr->head;

                // delete till deleteLen and reuse segments for new array if it is possible.
                // 3 steps -
                //1. delete 1st segment (which may be partial delete)
                // 2. delete next n complete segments
                // 3. delete last segment (which again may be partial delete)

                // Step (1)  -- WOOB 1116297: When left >= start, step (1) is skipped, resulting in pNewArr->head->left != 0. We need to touch up pNewArr.
                if (startSeg->left < start)
                {
                    if (start < startSeg->left + startSeg->length)
                    {
                        uint32 headDeleteLen = startSeg->left + startSeg->length - start;

                        if (startSeg->next)
                        {
                            // We know the new segment will have a next segment, so allocate it as non-leaf.
                            newHeadSeg = SparseArraySegment<T>::template AllocateSegmentImpl<false>(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        else
                        {
                            newHeadSeg = SparseArraySegment<T>::AllocateSegment(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        newHeadSeg = SparseArraySegment<T>::CopySegment(recycler, newHeadSeg, 0, startSeg, start, headDeleteLen);
                        newHeadSeg->next = nullptr;
                        *prevNewHeadSeg = newHeadSeg;
                        prevNewHeadSeg = &newHeadSeg->next;
                        startSeg->Truncate(start);
                    }
                    savePrev = startSeg;
                    prevPrevSeg = prevSeg;
                    prevSeg = &startSeg->next;
                    startSeg = SparseArraySegment<T>::From(startSeg->next);
                }

                // Step (2) first we should do a hard copy if we have an inline head Segment
                else if (hasInlineSegment && nullptr != startSeg)
                {
                    // start should be in between left and left + length
                    if (startSeg->left  <= start && start < startSeg->left + startSeg->length)
                    {
                        uint32 headDeleteLen = startSeg->left + startSeg->length - start;
                        if (startSeg->next)
                        {
                            // We know the new segment will have a next segment, so allocate it as non-leaf.
                            newHeadSeg = SparseArraySegment<T>::template AllocateSegmentImpl<false>(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        else
                        {
                            newHeadSeg = SparseArraySegment<T>::AllocateSegment(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        newHeadSeg = SparseArraySegment<T>::CopySegment(recycler, newHeadSeg, 0, startSeg, start, headDeleteLen);
                        *prevNewHeadSeg = newHeadSeg;
                        prevNewHeadSeg = &newHeadSeg->next;

                        // Remove the entire segment from the original array
                        *prevSeg = startSeg->next;
                        pArr->ClearElements(startSeg, 0);
                        startSeg = SparseArraySegment<T>::From(startSeg->next);
                    }
                    // if we have an inline head segment with 0 elements, remove it
                    else if (startSeg->left == 0 && startSeg->length == 0)
                    {
                        Assert(startSeg->size != 0);
                        *prevSeg = startSeg->next;
                        startSeg = SparseArraySegment<T>::From(startSeg->next);
                    }
                }
                // Step (2) proper
                SparseArraySegmentBase *temp = nullptr;
                while (startSeg && (startSeg->left + startSeg->length) <= limit)
                {
                    temp = startSeg->next;

                    // move that entire segment to new array
                    startSeg->left = startSeg->left - start;
                    startSeg->next = nullptr;
                    *prevNewHeadSeg = startSeg;
                    prevNewHeadSeg = &startSeg->next;

                    // Remove the entire segment from the original array
                    *prevSeg = temp;
                    startSeg = (SparseArraySegment<T>*)temp;
                }

                // Step(2) above could delete the original head segment entirely, causing current head not
                // starting from 0. Then if any of the following throw, we have a corrupted array. Need
                // protection here.
                bool dummyHeadNodeInserted = false;
                if (!savePrev && (!startSeg || startSeg->left != 0))
                {
                    Assert(pArr->head == startSeg);
                    pArr->EnsureHeadStartsFromZero<T>(recycler);
                    Assert(pArr->head && pArr->head->next == startSeg);

                    savePrev = pArr->head;
                    prevPrevSeg = prevSeg;
                    prevSeg = &pArr->head->next;
                    dummyHeadNodeInserted = true;
                }

                // Step (3)
                if (startSeg && (startSeg->left < limit))
                {
                    // copy the first part of the last segment to be deleted to new array
                    uint32 headDeleteLen = start + deleteLen - startSeg->left ;

                    newHeadSeg = SparseArraySegment<T>::AllocateSegment(recycler, startSeg->left -  start, headDeleteLen, (SparseArraySegmentBase *)nullptr);
                    newHeadSeg = SparseArraySegment<T>::CopySegment(recycler, newHeadSeg, startSeg->left -  start, startSeg, startSeg->left, headDeleteLen);
                    newHeadSeg->next = nullptr;
                    *prevNewHeadSeg = newHeadSeg;
                    prevNewHeadSeg = &newHeadSeg->next;

                    // move the last segment
                    MoveArray(startSeg->elements, startSeg->elements + headDeleteLen, startSeg->length - headDeleteLen);
                    startSeg->left = startSeg->left + headDeleteLen; // We are moving the left ahead to point to the right index
                    startSeg->length = startSeg->length - headDeleteLen;
                    startSeg->CheckLengthvsSize();
                    startSeg->Truncate(startSeg->left + startSeg->length);
                    startSeg->EnsureSizeInBound(); // Just truncated, size might exceed next.left
                }

                if (startSeg && ((startSeg->left - deleteLen + insertLen) == 0) && dummyHeadNodeInserted)
                {
                    Assert(start + insertLen == 0);
                    // Remove the dummy head node to preserve array consistency.
                    pArr->head = startSeg;
                    savePrev = nullptr;
                    prevSeg = &pArr->head;
                }

                while (startSeg)
                {
                    startSeg->left = startSeg->left - deleteLen + insertLen ;
                    if (startSeg->next == nullptr)
                    {
                        startSeg->EnsureSizeInBound();
                    }
                    startSeg = SparseArraySegment<T>::From(startSeg->next);
                }
            }
        }

        // The size of pnewArr head allocated in above step 1 might exceed next.left concatenated in step 2/3.
        pnewArr->head->EnsureSizeInBound();
        if (savePrev)
        {
            savePrev->EnsureSizeInBound();
        }

        // insert elements
        if (insertLen > 0)
        {
            Assert(!VarIs<JavascriptNativeIntArray>(pArr) && !VarIs<JavascriptNativeFloatArray>(pArr));

            // InsertPhase
            SparseArraySegment<T> *segInsert = nullptr;

            // see if we are just about the right of the previous segment
            Assert(!savePrev || savePrev->left <= start);
            if (savePrev && (start - savePrev->left < savePrev->size))
            {
                segInsert = (SparseArraySegment<T>*)savePrev;
                uint32 spaceLeft = segInsert->size - (start - segInsert->left);
                if(spaceLeft < insertLen)
                {
                    SparseArraySegment<T> *oldSegInsert = segInsert;
                    bool isInlineSegment = JavascriptArray::IsInlineSegment(segInsert, pArr);
                    if (!segInsert->next)
                    {
                        segInsert = segInsert->GrowByMin(recycler, insertLen - spaceLeft);
                    }
                    else
                    {
                        segInsert = segInsert->GrowByMinMax(recycler, insertLen - spaceLeft, segInsert->next->left - segInsert->left - segInsert->size);
                    }

                    if (isInlineSegment)
                    {
                        pArr->ClearElements(oldSegInsert, 0);
                    }
                }
                *prevPrevSeg = segInsert;
                segInsert->length = start + insertLen - segInsert->left;
                segInsert->CheckLengthvsSize();
            }
            else
            {
                segInsert = SparseArraySegment<T>::AllocateSegment(recycler, start, insertLen, *prevSeg);
                segInsert->next = *prevSeg;
                *prevSeg = segInsert;
                savePrev = segInsert;
            }

            uint32 relativeStart = start - segInsert->left;
            // inserted elements starts at argument 3 of splice(start, deleteNumber, insertelem1, insertelem2, insertelem3, ...);
            CopyArray(segInsert->elements + relativeStart, insertLen,
                      reinterpret_cast<const T*>(insertArgs), insertLen);
        }
    }